

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 EngineRelease(jx9 *pEngine)

{
  jx9_vm *pjVar1;
  jx9_vm *pNext;
  jx9_vm *pVm;
  jx9 *pEngine_local;
  
  pNext = pEngine->pVms;
  while (0 < pEngine->iVm) {
    pjVar1 = pNext->pNext;
    jx9VmRelease(pNext);
    pEngine->iVm = pEngine->iVm + -1;
    pNext = pjVar1;
  }
  pEngine->nMagic = 0x7635;
  SyMemBackendRelease(&pEngine->sAllocator);
  return 0;
}

Assistant:

static sxi32 EngineRelease(jx9 *pEngine)
{
	jx9_vm *pVm, *pNext;
	/* Release all active VM */
	pVm = pEngine->pVms;
	for(;;){
		if( pEngine->iVm < 1 ){
			break;
		}
		pNext = pVm->pNext;
		jx9VmRelease(pVm);
		pVm = pNext;
		pEngine->iVm--;
	}
	/* Set a dummy magic number */
	pEngine->nMagic = 0x7635;
	/* Release the private memory subsystem */
	SyMemBackendRelease(&pEngine->sAllocator); 
	return JX9_OK;
}